

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O2

void __thiscall QSocks5SocketEngine::~QSocks5SocketEngine(QSocks5SocketEngine *this)

{
  long lVar1;
  void *pvVar2;
  QSocks5BindData *this_00;
  long *plVar3;
  QSocks5UdpAssociateData *this_01;
  
  *(undefined ***)this = &PTR_metaObject_002cf070;
  lVar1 = *(long *)(this + 8);
  plVar3 = *(long **)(lVar1 + 0xf8);
  if (plVar3 != (long *)0x0) {
    if ((long *)plVar3[1] != (long *)0x0) {
      (**(code **)(*(long *)plVar3[1] + 8))();
      plVar3 = *(long **)(lVar1 + 0xf8);
    }
    if ((long *)*plVar3 != (long *)0x0) {
      (**(code **)(*(long *)*plVar3 + 0x20))();
    }
  }
  pvVar2 = *(void **)(lVar1 + 0x100);
  if (pvVar2 != (void *)0x0) {
    QArrayDataPointer<QRingChunk>::~QArrayDataPointer
              ((QArrayDataPointer<QRingChunk> *)((long)pvVar2 + 0x10));
    operator_delete(pvVar2,0x38);
  }
  this_01 = *(QSocks5UdpAssociateData **)(lVar1 + 0x108);
  if (this_01 == (QSocks5UdpAssociateData *)0x0) goto LAB_00220223;
  if (this_01->udpSocket == (QUdpSocket *)0x0) {
LAB_0022020b:
    QSocks5UdpAssociateData::~QSocks5UdpAssociateData(this_01);
  }
  else {
    (**(code **)(*(long *)&this_01->udpSocket->super_QAbstractSocket + 0x20))();
    this_01 = *(QSocks5UdpAssociateData **)(lVar1 + 0x108);
    if (this_01 != (QSocks5UdpAssociateData *)0x0) goto LAB_0022020b;
    this_01 = (QSocks5UdpAssociateData *)0x0;
  }
  operator_delete(this_01,0x40);
LAB_00220223:
  this_00 = *(QSocks5BindData **)(lVar1 + 0x110);
  if (this_00 != (QSocks5BindData *)0x0) {
    QSocks5BindData::~QSocks5BindData(this_00);
    operator_delete(this_00,0x40);
  }
  QObject::~QObject((QObject *)this);
  return;
}

Assistant:

QSocks5SocketEngine::~QSocks5SocketEngine()
{
    Q_D(QSocks5SocketEngine);

    if (d->data) {
        delete d->data->authenticator;
        delete d->data->controlSocket;
    }
    if (d->connectData)
        delete d->connectData;
#ifndef QT_NO_UDPSOCKET
    if (d->udpData) {
        delete d->udpData->udpSocket;
        delete d->udpData;
    }
#endif
    if (d->bindData)
        delete d->bindData;
}